

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_dist.h
# Opt level: O0

double manifold::DistanceTriangleTriangleSquared
                 (array<linalg::vec<double,_3>,_3UL> *p,array<linalg::vec<double,_3>,_3UL> *q)

{
  bool bVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  double *pdVar6;
  double dVar7;
  double local_690;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_580;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_568;
  vec<double,_3> local_550;
  apply_t<detail::op_div,_linalg::vec<double,_3>,_double> local_538;
  undefined1 local_520 [8];
  vec3 cq_2;
  vec3 cp_2;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_4d8;
  vec<double,_3> local_4c0;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_4a8;
  undefined1 local_490 [8];
  vec3 Z_2;
  vec3 V_2;
  vec3 *pIndex;
  undefined1 local_450 [4];
  int index_1;
  double local_438;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_430;
  double local_418;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_410;
  double local_3f8;
  undefined1 local_3f0 [8];
  vec3 Sp;
  double Tnl;
  vec3 Tn;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_3a0;
  undefined1 local_388 [8];
  vec3 cq_1;
  apply_t<detail::op_div,_linalg::vec<double,_3>,_double> local_358;
  undefined1 local_340 [8];
  vec3 cp_1;
  double local_320;
  double local_318;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_310;
  vec<double,_3> local_2f8;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_2e0;
  undefined1 local_2c8 [8];
  vec3 Z_1;
  vec3 V_1;
  vec3 *qIndex;
  undefined1 local_288 [4];
  int index;
  double local_270;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_268;
  double local_250;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_248;
  double local_230;
  undefined1 local_228 [8];
  vec3 Tp;
  double Snl;
  vec3 Sn;
  double b;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double a;
  vec3 Z;
  uint32_t id;
  double dd;
  vec3 V;
  vec3 cq;
  vec3 cp;
  uint32_t j;
  uint32_t i;
  double mindd;
  undefined1 auStack_140 [7];
  bool shown_disjoint;
  double local_138;
  double local_130;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_128;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_110;
  undefined1 local_f8 [8];
  array<linalg::vec<double,_3>,_3UL> Tv;
  double local_a8;
  double local_a0;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_98;
  apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> local_80;
  undefined1 local_68 [8];
  array<linalg::vec<double,_3>,_3UL> Sv;
  array<linalg::vec<double,_3>,_3UL> *q_local;
  array<linalg::vec<double,_3>,_3UL> *p_local;
  
  Sv._M_elems[2].z = (double)q;
  Manifold::std::array<linalg::vec<double,_3>,_3UL>::array
            ((array<linalg::vec<double,_3>,_3UL> *)local_68);
  pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,1);
  pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,0);
  linalg::operator-(&local_80,pvVar2,pvVar3);
  pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                     ((array<linalg::vec<double,_3>,_3UL> *)local_68,0);
  pvVar4->x = local_80.x;
  pvVar4->y = local_80.y;
  pvVar4->z = local_80.z;
  pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,2);
  pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,1);
  linalg::operator-(&local_98,pvVar2,pvVar3);
  pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                     ((array<linalg::vec<double,_3>,_3UL> *)local_68,1);
  pvVar4->x = local_98.x;
  pvVar4->y = local_98.y;
  pvVar4->z = local_98.z;
  pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,0);
  pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,2);
  linalg::operator-((apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> *)
                    &Tv._M_elems[2].z,pvVar2,pvVar3);
  pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                     ((array<linalg::vec<double,_3>,_3UL> *)local_68,2);
  pvVar4->x = Tv._M_elems[2].z;
  pvVar4->y = local_a8;
  pvVar4->z = local_a0;
  Manifold::std::array<linalg::vec<double,_3>,_3UL>::array
            ((array<linalg::vec<double,_3>,_3UL> *)local_f8);
  pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                     ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,1);
  pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                     ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,0);
  linalg::operator-(&local_110,pvVar2,pvVar3);
  pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                     ((array<linalg::vec<double,_3>,_3UL> *)local_f8,0);
  pvVar4->x = local_110.x;
  pvVar4->y = local_110.y;
  pvVar4->z = local_110.z;
  pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                     ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,2);
  pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                     ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,1);
  linalg::operator-(&local_128,pvVar2,pvVar3);
  pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                     ((array<linalg::vec<double,_3>,_3UL> *)local_f8,1);
  pvVar4->x = local_128.x;
  pvVar4->y = local_128.y;
  pvVar4->z = local_128.z;
  pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                     ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,0);
  pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                     ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,2);
  linalg::operator-((apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> *)
                    auStack_140,pvVar2,pvVar3);
  pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                     ((array<linalg::vec<double,_3>,_3UL> *)local_f8,2);
  pvVar4->x = _auStack_140;
  pvVar4->y = local_138;
  pvVar4->z = local_130;
  bVar1 = false;
  _j = Manifold::std::numeric_limits<double>::max();
  cp.z._4_4_ = 0;
  do {
    if (2 < cp.z._4_4_) {
      pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                         ((array<linalg::vec<double,_3>,_3UL> *)local_68,0);
      pvVar5 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                         ((array<linalg::vec<double,_3>,_3UL> *)local_68,1);
      linalg::cross<double>((vec<double,_3> *)&Snl,pvVar4,pvVar5);
      Tp.z = linalg::dot<double,3>((vec<double,_3> *)&Snl,(vec<double,_3> *)&Snl);
      if (1e-15 < Tp.z) {
        pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,0);
        pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                           ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,0);
        linalg::operator-(&local_248,pvVar2,pvVar3);
        local_230 = linalg::dot<double,3>(&local_248,(vec<double,_3> *)&Snl);
        pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,0);
        pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                           ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,1);
        linalg::operator-(&local_268,pvVar2,pvVar3);
        local_250 = linalg::dot<double,3>(&local_268,(vec<double,_3> *)&Snl);
        pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,0);
        pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                           ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,2);
        linalg::operator-((apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_>
                           *)local_288,pvVar2,pvVar3);
        local_270 = linalg::dot<double,3>((vec<double,_3> *)local_288,(vec<double,_3> *)&Snl);
        linalg::vec<double,_3>::vec((vec<double,_3> *)local_228,&local_230,&local_250,&local_270);
        qIndex._4_4_ = 0xffffffff;
        pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,0);
        if (((*pdVar6 <= 0.0) ||
            (pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,1),
            *pdVar6 <= 0.0)) ||
           (pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,2),
           *pdVar6 <= 0.0)) {
          pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,0);
          if (((*pdVar6 <= 0.0 && *pdVar6 != 0.0) &&
              (pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,1),
              *pdVar6 <= 0.0 && *pdVar6 != 0.0)) &&
             (pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,2),
             *pdVar6 <= 0.0 && *pdVar6 != 0.0)) {
            pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,0);
            dVar7 = *pdVar6;
            pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,1);
            qIndex._4_4_ = (uint)(dVar7 <= *pdVar6);
            pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,2);
            dVar7 = *pdVar6;
            pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,qIndex._4_4_);
            if (*pdVar6 <= dVar7 && dVar7 != *pdVar6) {
              qIndex._4_4_ = 2;
            }
          }
        }
        else {
          pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,0);
          dVar7 = *pdVar6;
          pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,1);
          qIndex._4_4_ = (uint)(*pdVar6 <= dVar7);
          pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,2);
          dVar7 = *pdVar6;
          pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_228,qIndex._4_4_);
          if (dVar7 < *pdVar6) {
            qIndex._4_4_ = 2;
          }
        }
        if (-1 < (int)qIndex._4_4_) {
          bVar1 = true;
          pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                             ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,
                              (long)(int)qIndex._4_4_);
          pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,0);
          linalg::operator-((apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_>
                             *)&Z_1.z,pvVar2,pvVar3);
          pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                             ((array<linalg::vec<double,_3>,_3UL> *)local_68,0);
          linalg::cross<double>((vec<double,_3> *)local_2c8,(vec<double,_3> *)&Snl,pvVar4);
          dVar7 = linalg::dot<double,3>((vec<double,_3> *)&Z_1.z,(vec<double,_3> *)local_2c8);
          if (0.0 < dVar7) {
            pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,1);
            linalg::operator-(&local_2e0,pvVar2,pvVar3);
            Z_1.z = local_2e0.x;
            pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                               ((array<linalg::vec<double,_3>,_3UL> *)local_68,1);
            linalg::cross<double>(&local_2f8,(vec<double,_3> *)&Snl,pvVar4);
            local_2c8 = (undefined1  [8])local_2f8.x;
            Z_1.x = local_2f8.y;
            Z_1.y = local_2f8.z;
            dVar7 = linalg::dot<double,3>((vec<double,_3> *)&Z_1.z,(vec<double,_3> *)local_2c8);
            if (0.0 < dVar7) {
              pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,2);
              linalg::operator-(&local_310,pvVar2,pvVar3);
              Z_1.z = local_310.x;
              pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                                 ((array<linalg::vec<double,_3>,_3UL> *)local_68,2);
              linalg::cross<double>((vec<double,_3> *)&cp_1.z,(vec<double,_3> *)&Snl,pvVar4);
              local_2c8 = (undefined1  [8])cp_1.z;
              Z_1.x = local_320;
              Z_1.y = local_318;
              dVar7 = linalg::dot<double,3>((vec<double,_3> *)&Z_1.z,(vec<double,_3> *)local_2c8);
              if (0.0 < dVar7) {
                pdVar6 = linalg::vec<double,_3>::operator[]
                                   ((vec<double,_3> *)local_228,qIndex._4_4_);
                linalg::operator*((vec<double,_3> *)&cq_1.z,(vec<double,_3> *)&Snl,pdVar6);
                linalg::operator/(&local_358,(vec<double,_3> *)&cq_1.z,&Tp.z);
                linalg::operator+((apply_t<detail::op_add,_linalg::vec<double,_3>,_linalg::vec<double,_3>_>
                                   *)local_340,pvVar2,&local_358);
                local_388 = (undefined1  [8])pvVar2->x;
                cq_1.x = pvVar2->y;
                cq_1.y = pvVar2->z;
                linalg::operator-(&local_3a0,(vec<double,_3> *)local_340,(vec<double,_3> *)local_388
                                 );
                linalg::operator-((apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_>
                                   *)&Tn.z,(vec<double,_3> *)local_340,(vec<double,_3> *)local_388);
                dVar7 = linalg::dot<double,3>(&local_3a0,(vec<double,_3> *)&Tn.z);
                return dVar7;
              }
            }
          }
        }
      }
      pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                         ((array<linalg::vec<double,_3>,_3UL> *)local_f8,0);
      pvVar5 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                         ((array<linalg::vec<double,_3>,_3UL> *)local_f8,1);
      linalg::cross<double>((vec<double,_3> *)&Tnl,pvVar4,pvVar5);
      Sp.z = linalg::dot<double,3>((vec<double,_3> *)&Tnl,(vec<double,_3> *)&Tnl);
      if (1e-15 < Sp.z) {
        pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                           ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,0);
        pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,0);
        linalg::operator-(&local_410,pvVar2,pvVar3);
        local_3f8 = linalg::dot<double,3>(&local_410,(vec<double,_3> *)&Tnl);
        pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                           ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,0);
        pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,1);
        linalg::operator-(&local_430,pvVar2,pvVar3);
        local_418 = linalg::dot<double,3>(&local_430,(vec<double,_3> *)&Tnl);
        pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                           ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,0);
        pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,2);
        linalg::operator-((apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_>
                           *)local_450,pvVar2,pvVar3);
        local_438 = linalg::dot<double,3>((vec<double,_3> *)local_450,(vec<double,_3> *)&Tnl);
        linalg::vec<double,_3>::vec((vec<double,_3> *)local_3f0,&local_3f8,&local_418,&local_438);
        pIndex._4_4_ = 0xffffffff;
        pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,0);
        if (((*pdVar6 <= 0.0) ||
            (pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,1),
            *pdVar6 <= 0.0)) ||
           (pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,2),
           *pdVar6 <= 0.0)) {
          pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,0);
          if (((*pdVar6 <= 0.0 && *pdVar6 != 0.0) &&
              (pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,1),
              *pdVar6 <= 0.0 && *pdVar6 != 0.0)) &&
             (pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,2),
             *pdVar6 <= 0.0 && *pdVar6 != 0.0)) {
            pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,0);
            dVar7 = *pdVar6;
            pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,1);
            pIndex._4_4_ = (uint)(dVar7 <= *pdVar6);
            pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,2);
            dVar7 = *pdVar6;
            pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,pIndex._4_4_);
            if (*pdVar6 <= dVar7 && dVar7 != *pdVar6) {
              pIndex._4_4_ = 2;
            }
          }
        }
        else {
          pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,0);
          dVar7 = *pdVar6;
          pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,1);
          pIndex._4_4_ = (uint)(*pdVar6 <= dVar7);
          pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,2);
          dVar7 = *pdVar6;
          pdVar6 = linalg::vec<double,_3>::operator[]((vec<double,_3> *)local_3f0,pIndex._4_4_);
          if (dVar7 < *pdVar6) {
            pIndex._4_4_ = 2;
          }
        }
        if (-1 < (int)pIndex._4_4_) {
          bVar1 = true;
          pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                             (p,(long)(int)pIndex._4_4_);
          pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                             ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,0);
          linalg::operator-((apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_>
                             *)&Z_2.z,pvVar2,pvVar3);
          pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                             ((array<linalg::vec<double,_3>,_3UL> *)local_f8,0);
          linalg::cross<double>((vec<double,_3> *)local_490,(vec<double,_3> *)&Tnl,pvVar4);
          dVar7 = linalg::dot<double,3>((vec<double,_3> *)&Z_2.z,(vec<double,_3> *)local_490);
          if (0.0 < dVar7) {
            pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                               ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,1);
            linalg::operator-(&local_4a8,pvVar2,pvVar3);
            Z_2.z = local_4a8.x;
            pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                               ((array<linalg::vec<double,_3>,_3UL> *)local_f8,1);
            linalg::cross<double>(&local_4c0,(vec<double,_3> *)&Tnl,pvVar4);
            local_490 = (undefined1  [8])local_4c0.x;
            Z_2.x = local_4c0.y;
            Z_2.y = local_4c0.z;
            dVar7 = linalg::dot<double,3>((vec<double,_3> *)&Z_2.z,(vec<double,_3> *)local_490);
            if (0.0 < dVar7) {
              pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                                 ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,2);
              linalg::operator-(&local_4d8,pvVar2,pvVar3);
              Z_2.z = local_4d8.x;
              pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                                 ((array<linalg::vec<double,_3>,_3UL> *)local_f8,2);
              linalg::cross<double>((vec<double,_3> *)&cp_2.z,(vec<double,_3> *)&Tnl,pvVar4);
              local_490 = (undefined1  [8])cp_2.z;
              dVar7 = linalg::dot<double,3>((vec<double,_3> *)&Z_2.z,(vec<double,_3> *)local_490);
              if (0.0 < dVar7) {
                cq_2.z = pvVar2->x;
                cp_2.x = pvVar2->y;
                cp_2.y = pvVar2->z;
                pdVar6 = linalg::vec<double,_3>::operator[]
                                   ((vec<double,_3> *)local_3f0,pIndex._4_4_);
                linalg::operator*(&local_550,(vec<double,_3> *)&Tnl,pdVar6);
                linalg::operator/(&local_538,&local_550,&Sp.z);
                linalg::operator+((apply_t<detail::op_add,_linalg::vec<double,_3>,_linalg::vec<double,_3>_>
                                   *)local_520,pvVar2,&local_538);
                linalg::operator-(&local_568,(vec<double,_3> *)&cq_2.z,(vec<double,_3> *)local_520);
                linalg::operator-(&local_580,(vec<double,_3> *)&cq_2.z,(vec<double,_3> *)local_520);
                dVar7 = linalg::dot<double,3>(&local_568,&local_580);
                return dVar7;
              }
            }
          }
        }
      }
      if (bVar1) {
        local_690 = _j;
      }
      else {
        local_690 = 0.0;
      }
      return local_690;
    }
    for (cp.z._0_4_ = 0; cp.z._0_4_ < 3; cp.z._0_4_ = cp.z._0_4_ + 1) {
      linalg::vec<double,_3>::vec((vec<double,_3> *)&cq.z);
      linalg::vec<double,_3>::vec((vec<double,_3> *)&V.z);
      pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,(ulong)cp.z._4_4_);
      pvVar4 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                         ((array<linalg::vec<double,_3>,_3UL> *)local_68,(ulong)cp.z._4_4_);
      pvVar3 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                         ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,(ulong)cp.z._0_4_);
      pvVar5 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                         ((array<linalg::vec<double,_3>,_3UL> *)local_f8,(ulong)cp.z._0_4_);
      EdgeEdgeDist((vec3 *)&cq.z,(vec3 *)&V.z,pvVar2,pvVar4,pvVar3,pvVar5);
      linalg::operator-((apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_> *)
                        &dd,(vec<double,_3> *)&V.z,(vec<double,_3> *)&cq.z);
      dVar7 = linalg::dot<double,3>((vec<double,_3> *)&dd,(vec<double,_3> *)&dd);
      if (dVar7 <= _j) {
        Z.z._4_4_ = cp.z._4_4_ + 2;
        if (2 < Z.z._4_4_) {
          Z.z._4_4_ = cp.z._4_4_ - 1;
        }
        pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[](p,(ulong)Z.z._4_4_);
        linalg::operator-((apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_>
                           *)&a,pvVar2,(vec<double,_3> *)&cq.z);
        local_1d0 = linalg::dot<double,3>((vec<double,_3> *)&a,(vec<double,_3> *)&dd);
        Z.z._4_4_ = cp.z._0_4_ + 2;
        if (2 < Z.z._4_4_) {
          Z.z._4_4_ = cp.z._0_4_ - 1;
        }
        pvVar2 = Manifold::std::array<linalg::vec<double,_3>,_3UL>::operator[]
                           ((array<linalg::vec<double,_3>,_3UL> *)Sv._M_elems[2].z,(ulong)Z.z._4_4_)
        ;
        linalg::operator-((apply_t<detail::op_sub,_linalg::vec<double,_3>,_linalg::vec<double,_3>_>
                           *)&b,pvVar2,(vec<double,_3> *)&V.z);
        a = b;
        Z.x = local_1e0;
        Z.y = local_1d8;
        Sn.z = linalg::dot<double,3>((vec<double,_3> *)&a,(vec<double,_3> *)&dd);
        if ((local_1d0 <= 0.0) && (0.0 <= Sn.z)) {
          dVar7 = linalg::dot<double,3>((vec<double,_3> *)&dd,(vec<double,_3> *)&dd);
          return dVar7;
        }
        if (0.0 < local_1d0) {
          if (0.0 < Sn.z) {
            Sn.z = 0.0;
          }
        }
        else {
          local_1d0 = 0.0;
        }
        _j = dVar7;
        if (0.0 < (dVar7 - local_1d0) + Sn.z) {
          bVar1 = true;
        }
      }
    }
    cp.z._4_4_ = cp.z._4_4_ + 1;
  } while( true );
}

Assistant:

inline auto DistanceTriangleTriangleSquared(const std::array<vec3, 3>& p,
                                            const std::array<vec3, 3>& q) {
  std::array<vec3, 3> Sv;
  Sv[0] = p[1] - p[0];
  Sv[1] = p[2] - p[1];
  Sv[2] = p[0] - p[2];

  std::array<vec3, 3> Tv;
  Tv[0] = q[1] - q[0];
  Tv[1] = q[2] - q[1];
  Tv[2] = q[0] - q[2];

  bool shown_disjoint = false;

  auto mindd = std::numeric_limits<double>::max();

  for (uint32_t i = 0; i < 3; i++) {
    for (uint32_t j = 0; j < 3; j++) {
      vec3 cp;
      vec3 cq;
      EdgeEdgeDist(cp, cq, p[i], Sv[i], q[j], Tv[j]);
      const vec3 V = cq - cp;
      const auto dd = la::dot(V, V);

      if (dd <= mindd) {
        mindd = dd;

        uint32_t id = i + 2;
        if (id >= 3) id -= 3;
        vec3 Z = p[id] - cp;
        auto a = la::dot(Z, V);
        id = j + 2;
        if (id >= 3) id -= 3;
        Z = q[id] - cq;
        auto b = la::dot(Z, V);

        if ((a <= 0.0) && (b >= 0.0)) {
          return la::dot(V, V);
        };

        if (a <= 0.0)
          a = 0.0;
        else if (b > 0.0)
          b = 0.0;

        if ((mindd - a + b) > 0.0) shown_disjoint = true;
      }
    }
  }

  vec3 Sn = la::cross(Sv[0], Sv[1]);
  auto Snl = la::dot(Sn, Sn);

  if (Snl > 1e-15) {
    const vec3 Tp(la::dot(p[0] - q[0], Sn), la::dot(p[0] - q[1], Sn),
                  la::dot(p[0] - q[2], Sn));

    int index = -1;
    if ((Tp[0] > 0.0) && (Tp[1] > 0.0) && (Tp[2] > 0.0)) {
      index = Tp[0] < Tp[1] ? 0 : 1;
      if (Tp[2] < Tp[index]) index = 2;
    } else if ((Tp[0] < 0.0) && (Tp[1] < 0.0) && (Tp[2] < 0.0)) {
      index = Tp[0] > Tp[1] ? 0 : 1;
      if (Tp[2] > Tp[index]) index = 2;
    }

    if (index >= 0) {
      shown_disjoint = true;

      const vec3& qIndex = q[index];

      vec3 V = qIndex - p[0];
      vec3 Z = la::cross(Sn, Sv[0]);
      if (la::dot(V, Z) > 0.0) {
        V = qIndex - p[1];
        Z = la::cross(Sn, Sv[1]);
        if (la::dot(V, Z) > 0.0) {
          V = qIndex - p[2];
          Z = la::cross(Sn, Sv[2]);
          if (la::dot(V, Z) > 0.0) {
            vec3 cp = qIndex + Sn * Tp[index] / Snl;
            vec3 cq = qIndex;
            return la::dot(cp - cq, cp - cq);
          }
        }
      }
    }
  }

  vec3 Tn = la::cross(Tv[0], Tv[1]);
  auto Tnl = la::dot(Tn, Tn);

  if (Tnl > 1e-15) {
    const vec3 Sp(la::dot(q[0] - p[0], Tn), la::dot(q[0] - p[1], Tn),
                  la::dot(q[0] - p[2], Tn));

    int index = -1;
    if ((Sp[0] > 0.0) && (Sp[1] > 0.0) && (Sp[2] > 0.0)) {
      index = Sp[0] < Sp[1] ? 0 : 1;
      if (Sp[2] < Sp[index]) index = 2;
    } else if ((Sp[0] < 0.0) && (Sp[1] < 0.0) && (Sp[2] < 0.0)) {
      index = Sp[0] > Sp[1] ? 0 : 1;
      if (Sp[2] > Sp[index]) index = 2;
    }

    if (index >= 0) {
      shown_disjoint = true;

      const vec3& pIndex = p[index];

      vec3 V = pIndex - q[0];
      vec3 Z = la::cross(Tn, Tv[0]);
      if (la::dot(V, Z) > 0.0) {
        V = pIndex - q[1];
        Z = la::cross(Tn, Tv[1]);
        if (la::dot(V, Z) > 0.0) {
          V = pIndex - q[2];
          Z = la::cross(Tn, Tv[2]);
          if (la::dot(V, Z) > 0.0) {
            vec3 cp = pIndex;
            vec3 cq = pIndex + Tn * Sp[index] / Tnl;
            return la::dot(cp - cq, cp - cq);
          }
        }
      }
    }
  }

  return shown_disjoint ? mindd : 0.0;
}